

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse_Args.cpp
# Opt level: O2

int __thiscall Nova::Parse_Args::Find_Match(Parse_Args *this,string *str)

{
  pointer pAVar1;
  __type _Var2;
  long lVar3;
  int i;
  ulong uVar4;
  
  lVar3 = 8;
  uVar4 = 0;
  while( true ) {
    pAVar1 = (this->arg_data_list).
             super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->arg_data_list).
                       super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pAVar1) / 0x138) <= uVar4) {
      return -1;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pAVar1->type + lVar3),str);
    if (_Var2) break;
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x138;
  }
  return (int)uVar4;
}

Assistant:

int Parse_Args::
Find_Match(const std::string& str) const
{
    for(int i=0;i<arg_data_list.size();i++) if(arg_data_list[i].str==str) return i;
    return -1;
}